

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strpool.h
# Opt level: O2

void strpool_discard(strpool_t *pool,unsigned_long_long handle)

{
  int iVar1;
  int iVar2;
  strpool_internal_handle_t *psVar3;
  strpool_internal_block_t *psVar4;
  int *piVar5;
  int *piVar6;
  strpool_internal_hash_slot_t *psVar7;
  strpool_internal_entry_t *psVar8;
  char *pcVar9;
  undefined8 uVar10;
  strpool_internal_entry_t *psVar11;
  uint uVar12;
  strpool_internal_entry_t *psVar13;
  ulong uVar14;
  uint uVar15;
  int iVar16;
  strpool_internal_free_block_t *new_entry;
  uint uVar17;
  ulong uVar18;
  int iVar19;
  uint uVar20;
  int iVar21;
  
  psVar13 = strpool_internal_get_entry(pool,handle);
  if ((psVar13 != (strpool_internal_entry_t *)0x0) && (psVar13->refcount == 0)) {
    psVar3 = pool->handles;
    iVar1 = psVar13->handle_index;
    iVar2 = psVar3[iVar1].entry_index;
    uVar18 = 0;
    uVar14 = (ulong)(uint)pool->block_count;
    if (pool->block_count < 1) {
      uVar14 = uVar18;
    }
    for (; uVar14 * 0x20 != uVar18; uVar18 = uVar18 + 0x20) {
      psVar4 = pool->blocks;
      piVar5 = (int *)psVar13->data;
      piVar6 = *(int **)((long)&psVar4->data + uVar18);
      if ((piVar6 <= piVar5) && (piVar5 <= *(int **)((long)&psVar4->tail + uVar18))) {
        uVar17 = *(uint *)((long)&psVar4->free_list + uVar18);
        iVar16 = (int)piVar5;
        iVar19 = (int)piVar6;
        if (-1 < (int)uVar17) {
          uVar12 = uVar17;
          uVar15 = 0xffffffff;
          goto LAB_00104823;
        }
        *(int *)((long)&psVar4->free_list + uVar18) = iVar16 - iVar19;
        piVar5[1] = -1;
        iVar21 = psVar13->size;
        goto LAB_00104882;
      }
    }
LAB_00104885:
    if ((long)pool->handle_freelist_tail < 0) {
      if (-1 < pool->handle_freelist_head) {
        __assert_fail("pool->handle_freelist_head < 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/../3rdparty/mattias/strpool.h"
                      ,0x459,"void strpool_discard(strpool_t *, unsigned long long)");
      }
      pool->handle_freelist_head = iVar1;
    }
    else {
      psVar3[pool->handle_freelist_tail].entry_index = iVar1;
    }
    pool->handle_freelist_tail = iVar1;
    psVar3[iVar1].counter = psVar3[iVar1].counter + 1;
    psVar3[iVar1].entry_index = -1;
    psVar7 = pool->hash_table;
    iVar1 = psVar13->hash_slot;
    if ((long)(int)psVar7[iVar1].hash_key == 0) {
      __assert_fail("hash",
                    "/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/../3rdparty/mattias/strpool.h"
                    ,0x468,"void strpool_discard(strpool_t *, unsigned long long)");
    }
    psVar7[(long)pool->hash_capacity - 1U & (long)(int)psVar7[iVar1].hash_key].base_count =
         psVar7[(long)pool->hash_capacity - 1U & (long)(int)psVar7[iVar1].hash_key].base_count + -1;
    psVar7[iVar1].hash_key = 0;
    uVar14 = (long)pool->entry_count - 1;
    if (iVar2 != (int)uVar14) {
      psVar8 = pool->entries;
      psVar13 = psVar8 + uVar14;
      iVar16 = psVar13->hash_slot;
      iVar19 = psVar13->handle_index;
      pcVar9 = psVar13->data;
      psVar13 = psVar8 + uVar14;
      iVar1 = psVar13->length;
      uVar10 = *(undefined8 *)(&psVar13->size + 2);
      psVar11 = psVar8 + iVar2;
      psVar11->size = psVar13->size;
      psVar11->length = iVar1;
      *(undefined8 *)(&psVar11->size + 2) = uVar10;
      psVar8 = psVar8 + iVar2;
      psVar8->hash_slot = iVar16;
      psVar8->handle_index = iVar19;
      psVar8->data = pcVar9;
      psVar13 = pool->entries;
      pool->hash_table[psVar13[iVar2].hash_slot].entry_index = iVar2;
      pool->handles[psVar13[iVar2].handle_index].entry_index = iVar2;
      uVar14 = (ulong)(pool->entry_count - 1);
    }
    pool->entry_count = (int)uVar14;
  }
  return;
LAB_00104823:
  uVar20 = uVar12;
  if ((int)uVar20 < 0) goto LAB_00104885;
  uVar14 = (ulong)uVar20;
  iVar21 = psVar13->size;
  if (*(int *)((long)piVar6 + uVar14) <= iVar21) {
    if ((int)uVar15 < 0) {
      *(int *)((long)&psVar4->free_list + uVar18) = iVar16 - iVar19;
    }
    else {
      *(int *)((long)piVar6 + (ulong)uVar15 + 4) = iVar16 - iVar19;
      uVar17 = *(uint *)((long)piVar6 + uVar14 + 4);
    }
    piVar5[1] = uVar17;
LAB_00104882:
    *piVar5 = iVar21;
    goto LAB_00104885;
  }
  uVar12 = *(uint *)((long)piVar6 + uVar14 + 4);
  uVar15 = uVar20;
  goto LAB_00104823;
}

Assistant:

void strpool_discard( strpool_t* pool, STRPOOL_U64 handle )
    {   
    strpool_internal_entry_t* entry = strpool_internal_get_entry( pool, handle );
    if( entry && entry->refcount == 0 )
        {
        int entry_index = pool->handles[ entry->handle_index ].entry_index;

        // recycle string mem
        for( int i = 0; i < pool->block_count; ++i )
            {
            strpool_internal_block_t* block = &pool->blocks[ i ];
            if( entry->data >= block->data && entry->data <= block->tail )
                {
                if( block->free_list < 0 )
                    {
                    strpool_internal_free_block_t* new_entry = (strpool_internal_free_block_t*) ( entry->data );
                    block->free_list = (int) ( entry->data - block->data );
                    new_entry->next = -1;
                    new_entry->size = entry->size;
                    }
                else
                    {
                    int free_list = block->free_list;
                    int prev_list = -1;
                    while( free_list >= 0 )
                        {
                        strpool_internal_free_block_t* free_entry = 
                            (strpool_internal_free_block_t*) ( pool->blocks[ i ].data + free_list );
                        if( free_entry->size <= entry->size ) 
                            {
                            strpool_internal_free_block_t* new_entry = (strpool_internal_free_block_t*) ( entry->data );
                            if( prev_list < 0 )
                                {
                                new_entry->next = pool->blocks[ i ].free_list;
                                pool->blocks[ i ].free_list = (int) ( entry->data - block->data );          
                                }
                            else
                                {
                                strpool_internal_free_block_t* prev_entry = 
                                    (strpool_internal_free_block_t*) ( pool->blocks[ i ].data + prev_list );
                                prev_entry->next = (int) ( entry->data - block->data );
                                new_entry->next = free_entry->next;
                                }
                            new_entry->size = entry->size;
                            break;
                            }
                        prev_list = free_list;
                        free_list = free_entry->next;
                        }
                    }
                break;
                }
            }

        // recycle handle
        if( pool->handle_freelist_tail < 0 )
            {
            STRPOOL_ASSERT( pool->handle_freelist_head < 0 );
            pool->handle_freelist_head = entry->handle_index;
            pool->handle_freelist_tail = entry->handle_index;
            }
        else
            {
            pool->handles[ pool->handle_freelist_tail ].entry_index = entry->handle_index;
            pool->handle_freelist_tail = entry->handle_index;
            }
        ++pool->handles[ entry->handle_index ].counter; // invalidate handle via counter
        pool->handles[ entry->handle_index ].entry_index = -1;

        // recycle hash slot
        STRPOOL_U32 hash = pool->hash_table[ entry->hash_slot ].hash_key;
        int base_slot = (int)( hash & (STRPOOL_U32)( pool->hash_capacity - 1 ) );
        STRPOOL_ASSERT( hash );
        --pool->hash_table[ base_slot ].base_count;
        pool->hash_table[ entry->hash_slot ].hash_key = 0;

        // recycle entry
        if( entry_index != pool->entry_count - 1 )
            {
            pool->entries[ entry_index ] = pool->entries[ pool->entry_count - 1 ];
            pool->hash_table[ pool->entries[ entry_index ].hash_slot ].entry_index = entry_index;
            pool->handles[ pool->entries[ entry_index ].handle_index ].entry_index = entry_index;
            }
        --pool->entry_count;
        }       

    }